

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationDataBuilder::setDigitTags(CollationDataBuilder *this,UErrorCode *errorCode)

{
  UBool UVar1;
  UChar32 c_00;
  uint32_t uVar2;
  int32_t index_00;
  int32_t length;
  int32_t index;
  uint32_t ce32;
  UChar32 c;
  UnicodeSetIterator iter;
  ConstChar16Ptr local_b8;
  UnicodeString local_b0;
  undefined1 local_70 [8];
  UnicodeSet digits;
  UErrorCode *errorCode_local;
  CollationDataBuilder *this_local;
  
  digits._80_8_ = errorCode;
  ConstChar16Ptr::ConstChar16Ptr(&local_b8,L"[:Nd:]");
  UnicodeString::UnicodeString(&local_b0,'\x01',&local_b8,-1);
  UnicodeSet::UnicodeSet((UnicodeSet *)local_70,&local_b0,(UErrorCode *)digits._80_8_);
  UnicodeString::~UnicodeString(&local_b0);
  ConstChar16Ptr::~ConstChar16Ptr(&local_b8);
  UVar1 = ::U_FAILURE(*(UErrorCode *)digits._80_8_);
  if (UVar1 == '\0') {
    UnicodeSetIterator::UnicodeSetIterator((UnicodeSetIterator *)&ce32,(UnicodeSet *)local_70);
    while (UVar1 = UnicodeSetIterator::next((UnicodeSetIterator *)&ce32), UVar1 != '\0') {
      c_00 = UnicodeSetIterator::getCodepoint((UnicodeSetIterator *)&ce32);
      uVar2 = utrie2_get32_63(this->trie,c_00);
      if ((uVar2 != 0xc0) && (uVar2 != 0xffffffff)) {
        index_00 = addCE32(this,uVar2,(UErrorCode *)digits._80_8_);
        UVar1 = ::U_FAILURE(*(UErrorCode *)digits._80_8_);
        if (UVar1 != '\0') {
          iter.cpString._0_4_ = 1;
          goto LAB_0028a79f;
        }
        if (0x7ffff < index_00) {
          *(undefined4 *)digits._80_8_ = 0xf;
          iter.cpString._0_4_ = 1;
          goto LAB_0028a79f;
        }
        length = u_charDigitValue_63(c_00);
        uVar2 = Collation::makeCE32FromTagIndexAndLength(10,index_00,length);
        utrie2_set32_63(this->trie,c_00,uVar2,(UErrorCode *)digits._80_8_);
      }
    }
    iter.cpString._0_4_ = 0;
LAB_0028a79f:
    UnicodeSetIterator::~UnicodeSetIterator((UnicodeSetIterator *)&ce32);
  }
  else {
    iter.cpString._0_4_ = 1;
  }
  UnicodeSet::~UnicodeSet((UnicodeSet *)local_70);
  return;
}

Assistant:

void
CollationDataBuilder::setDigitTags(UErrorCode &errorCode) {
    UnicodeSet digits(UNICODE_STRING_SIMPLE("[:Nd:]"), errorCode);
    if(U_FAILURE(errorCode)) { return; }
    UnicodeSetIterator iter(digits);
    while(iter.next()) {
        U_ASSERT(!iter.isString());
        UChar32 c = iter.getCodepoint();
        uint32_t ce32 = utrie2_get32(trie, c);
        if(ce32 != Collation::FALLBACK_CE32 && ce32 != Collation::UNASSIGNED_CE32) {
            int32_t index = addCE32(ce32, errorCode);
            if(U_FAILURE(errorCode)) { return; }
            if(index > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return;
            }
            ce32 = Collation::makeCE32FromTagIndexAndLength(
                    Collation::DIGIT_TAG, index, u_charDigitValue(c));
            utrie2_set32(trie, c, ce32, &errorCode);
        }
    }
}